

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

char * duckdb_re2::re2_internal::TerminateNumber
                 (char *buf,size_t nbuf,char *str,size_t *np,bool accept_spaces)

{
  int iVar1;
  ulong uVar2;
  char cVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  
  sVar7 = *np;
  pcVar5 = anon_var_dwarf_889e57 + 9;
  if (sVar7 != 0) {
    cVar3 = *str;
    iVar1 = isspace((int)cVar3);
    if (iVar1 == 0) {
LAB_00407126:
      uVar2 = (ulong)(cVar3 == '-');
      pcVar4 = str + uVar2;
      uVar6 = sVar7 - uVar2;
      uVar8 = uVar6;
      if (((2 < uVar6) && (*pcVar4 == '0')) && (pcVar4[1] == '0')) {
        do {
          uVar8 = uVar6;
          if (pcVar4[2] != '0') break;
          uVar6 = uVar6 - 1;
          pcVar4 = pcVar4 + 1;
          uVar8 = 2;
        } while (2 < uVar6);
      }
      sVar7 = uVar8 + uVar2;
      if (nbuf - 1 < sVar7) {
        return pcVar5;
      }
      memmove(buf,pcVar4 + -uVar2,sVar7);
      if (cVar3 == '-') {
        *buf = '-';
      }
    }
    else {
      if (!accept_spaces) {
        return pcVar5;
      }
      while (sVar7 != 0) {
        cVar3 = *str;
        iVar1 = isspace((int)cVar3);
        if (iVar1 == 0) goto LAB_00407126;
        str = str + 1;
        sVar7 = sVar7 - 1;
      }
      sVar7 = 0;
    }
    buf[sVar7] = '\0';
    *np = sVar7;
    pcVar5 = buf;
  }
  return pcVar5;
}

Assistant:

static const char* TerminateNumber(char* buf, size_t nbuf, const char* str,
                                   size_t* np, bool accept_spaces) {
  size_t n = *np;
  if (n == 0) return "";
  if (n > 0 && isspace(*str)) {
    // We are less forgiving than the strtoxxx() routines and do not
    // allow leading spaces. We do allow leading spaces for floats.
    if (!accept_spaces) {
      return "";
    }
    while (n > 0 && isspace(*str)) {
      n--;
      str++;
    }
  }

  // Although buf has a fixed maximum size, we can still handle
  // arbitrarily large integers correctly by omitting leading zeros.
  // (Numbers that are still too long will be out of range.)
  // Before deciding whether str is too long,
  // remove leading zeros with s/000+/00/.
  // Leaving the leading two zeros in place means that
  // we don't change 0000x123 (invalid) into 0x123 (valid).
  // Skip over leading - before replacing.
  bool neg = false;
  if (n >= 1 && str[0] == '-') {
    neg = true;
    n--;
    str++;
  }

  if (n >= 3 && str[0] == '0' && str[1] == '0') {
    while (n >= 3 && str[2] == '0') {
      n--;
      str++;
    }
  }

  if (neg) {  // make room in buf for -
    n++;
    str--;
  }

  if (n > nbuf-1) return "";

  memmove(buf, str, n);
  if (neg) {
    buf[0] = '-';
  }
  buf[n] = '\0';
  *np = n;
  return buf;
}